

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSAttribute.cpp
# Opt level: O0

bool __thiscall OSAttribute::peekValue(OSAttribute *this,ByteString *value)

{
  bool bVar1;
  uchar *__src;
  size_t sVar2;
  reference puVar3;
  uchar *puVar4;
  ByteString *in_RSI;
  long in_RDI;
  const_iterator i;
  CK_MECHANISM_TYPE mech;
  size_t counter;
  ByteString *in_stack_ffffffffffffff78;
  ByteString *in_stack_ffffffffffffff80;
  _Self local_38;
  _Self local_30;
  unsigned_long local_28;
  long local_20;
  bool local_1;
  
  local_20 = 0;
  switch(*(undefined4 *)(in_RDI + 8)) {
  case 0:
    ByteString::resize(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
    puVar4 = ByteString::operator[](in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
    sVar2 = ByteString::size((ByteString *)0x158dc8);
    memcpy(puVar4,(void *)(in_RDI + 0xc),sVar2);
    local_1 = true;
    break;
  case 1:
    ByteString::resize(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
    puVar4 = ByteString::operator[](in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
    sVar2 = ByteString::size((ByteString *)0x158e24);
    memcpy(puVar4,(void *)(in_RDI + 0x10),sVar2);
    local_1 = true;
    break;
  case 2:
    ByteString::size((ByteString *)0x158e5b);
    ByteString::resize(in_RSI,(size_t)in_stack_ffffffffffffff78);
    puVar4 = ByteString::operator[](in_RSI,(size_t)in_stack_ffffffffffffff78);
    __src = ByteString::const_byte_str(in_stack_ffffffffffffff78);
    sVar2 = ByteString::size((ByteString *)0x158e98);
    memcpy(puVar4,__src,sVar2);
    local_1 = true;
    break;
  case 3:
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               0x158ece);
    ByteString::resize(in_stack_ffffffffffffff80,(size_t)in_RSI);
    local_30._M_node =
         (_Base_ptr)
         std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                   ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    in_RSI);
    while( true ) {
      local_38._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)in_RSI);
      bVar1 = std::operator!=(&local_30,&local_38);
      if (!bVar1) break;
      puVar3 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                         ((_Rb_tree_const_iterator<unsigned_long> *)in_stack_ffffffffffffff80);
      local_28 = *puVar3;
      puVar4 = ByteString::operator[](in_stack_ffffffffffffff80,(size_t)in_RSI);
      *(unsigned_long *)(puVar4 + local_20 * 8) = local_28;
      local_20 = local_20 + 1;
      std::_Rb_tree_const_iterator<unsigned_long>::operator++
                ((_Rb_tree_const_iterator<unsigned_long> *)in_stack_ffffffffffffff80);
    }
    local_1 = true;
    break;
  case 4:
    local_1 = false;
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool OSAttribute::peekValue(ByteString& value) const
{
	size_t counter = 0;
	CK_MECHANISM_TYPE mech;

	switch (attributeType)
	{
		case BOOL:
			value.resize(sizeof(boolValue));
			memcpy(&value[0], &boolValue, value.size());
			return true;

		case ULONG:
			value.resize(sizeof(ulongValue));
			memcpy(&value[0], &ulongValue, value.size());
			return true;

		case BYTESTR:
			value.resize(byteStrValue.size());
			memcpy(&value[0], byteStrValue.const_byte_str(), value.size());
			return true;

		case MECHSET:
			value.resize(mechSetValue.size() * sizeof(mech));
			for (std::set<CK_MECHANISM_TYPE>::const_iterator i = mechSetValue.begin(); i != mechSetValue.end(); ++i)
			{
				mech = *i;
				memcpy(&value[0] + counter * sizeof(mech), &mech, sizeof(mech));
				counter++;
			}
			return true;

		case ATTRMAP:
			return false;

		default:
			return false;
	}
}